

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepTiledOutputFile::copyPixels(DeepTiledOutputFile *this,DeepTiledInputFile *in)

{
  LineOrder LVar1;
  bool bVar2;
  TileDescription *this_00;
  TileDescription *other;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *pAVar5;
  LineOrder *pLVar6;
  Compression *pCVar7;
  LogicExc *this_01;
  reference pvVar8;
  size_type unpackedDataSize;
  size_type sVar9;
  reference pvVar10;
  DeepTiledInputFile *in_RSI;
  long in_RDI;
  TileCoord TVar11;
  char *pixelData;
  char *sampleCountTable;
  uint64_t unpackedPixelDataSize;
  uint64_t pixelDataSize;
  uint64_t sampleCountTableSize;
  uint64_t dataSize;
  int ly;
  int lx;
  int dy;
  int dx;
  size_t i;
  vector<char,_std::allocator<char>_> data;
  vector<int,_std::allocator<int>_> ly_list;
  vector<int,_std::allocator<int>_> lx_list;
  vector<int,_std::allocator<int>_> dy_list;
  vector<int,_std::allocator<int>_> dx_list;
  lock_guard<std::mutex> lock;
  size_t numAllTiles;
  stringstream _iex_throw_s_5;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  Header *inHdr;
  Header *hdr;
  mutex_type *in_stack_fffffffffffff2f8;
  lock_guard<std::mutex> *in_stack_fffffffffffff300;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffff308;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffff310;
  char *in_stack_fffffffffffff318;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff320;
  TileOffsets *in_stack_fffffffffffff328;
  Data *ofd;
  DeepTiledInputFile *in_stack_fffffffffffff340;
  ChannelList *in_stack_fffffffffffff348;
  DeepTiledInputFile *in_stack_fffffffffffff350;
  vector<char,_std::allocator<char>_> *this_02;
  DeepTiledInputFile *sampleCountTableSize_00;
  undefined4 in_stack_fffffffffffff4b8;
  Compression CVar12;
  Data *in_stack_fffffffffffff4c0;
  int *in_stack_fffffffffffff4c8;
  int *in_stack_fffffffffffff4d0;
  int *in_stack_fffffffffffff4d8;
  DeepTiledInputFile *in_stack_fffffffffffff4e0;
  ulong local_a28;
  allocator<char> local_a19;
  vector<char,_std::allocator<char>_> local_a18;
  vector<int,_std::allocator<int>_> local_9f8;
  vector<int,_std::allocator<int>_> local_9d8;
  vector<int,_std::allocator<int>_> local_9b8;
  vector<int,_std::allocator<int>_> local_998;
  size_t local_978;
  stringstream local_970 [16];
  ostream local_960 [56];
  char *in_stack_fffffffffffff6d8;
  int *in_stack_fffffffffffff6e0;
  pointer in_stack_fffffffffffff6e8;
  pointer in_stack_fffffffffffff6f0;
  pointer in_stack_fffffffffffff6f8;
  DeepTiledInputFile *in_stack_fffffffffffff700;
  pointer in_stack_fffffffffffff710;
  stringstream local_7e8 [16];
  ostream local_7d8 [376];
  stringstream local_660 [16];
  ostream local_650 [376];
  stringstream local_4d8 [16];
  ostream local_4c8 [376];
  stringstream local_350 [16];
  ostream local_340 [392];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  Header *local_30;
  undefined8 local_28;
  DeepTiledInputFile *local_20;
  
  local_28 = *(undefined8 *)(in_RDI + 8);
  local_20 = in_RSI;
  local_30 = DeepTiledInputFile::header(in_stack_fffffffffffff350);
  this_00 = Header::tileDescription((Header *)0x1c6368);
  other = Header::tileDescription((Header *)0x1c637d);
  bVar2 = TileDescription::operator==(this_00,other);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar3 = std::operator<<(local_1a8,"Quick pixel copy from image file \"");
    pcVar4 = DeepTiledInputFile::fileName((DeepTiledInputFile *)0x1c63d4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\" to image file \"");
    pcVar4 = fileName((DeepTiledOutputFile *)0x1c6428);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\" failed. The files have different tile descriptions.");
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_1b8);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  Header::dataWindow((Header *)0x1c6504);
  Header::dataWindow((Header *)0x1c6519);
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    (in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_350);
    poVar3 = std::operator<<(local_340,"Cannot copy pixels from image file \"");
    pcVar4 = DeepTiledInputFile::fileName((DeepTiledInputFile *)0x1c6570);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\" to image file \"");
    pcVar4 = fileName((DeepTiledOutputFile *)0x1c65c4);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\". The files have different data windows.");
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_350);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pLVar6 = Header::lineOrder((Header *)0x1c66a0);
  LVar1 = *pLVar6;
  pLVar6 = Header::lineOrder((Header *)0x1c66b6);
  if (LVar1 != *pLVar6) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4d8);
    poVar3 = std::operator<<(local_4c8,"Quick pixel copy from image file \"");
    pcVar4 = DeepTiledInputFile::fileName((DeepTiledInputFile *)0x1c6707);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\" to image file \"");
    pcVar4 = fileName((DeepTiledOutputFile *)0x1c675b);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\" failed. The files have different line orders.");
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_4d8);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pCVar7 = Header::compression((Header *)0x1c6837);
  CVar12 = *pCVar7;
  pCVar7 = Header::compression((Header *)0x1c684d);
  if (CVar12 != *pCVar7) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_660);
    poVar3 = std::operator<<(local_650,"Quick pixel copy from image file \"");
    pcVar4 = DeepTiledInputFile::fileName((DeepTiledInputFile *)0x1c689e);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\" to image file \"");
    pcVar4 = fileName((DeepTiledOutputFile *)0x1c68f2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\" failed. The files use different compression methods.");
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_660);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  Header::channels((Header *)0x1c69ce);
  Header::channels((Header *)0x1c69e3);
  bVar2 = ChannelList::operator==
                    (in_stack_fffffffffffff348,(ChannelList *)in_stack_fffffffffffff340);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_7e8);
    poVar3 = std::operator<<(local_7d8,"Quick pixel copy from image file \"");
    pcVar4 = DeepTiledInputFile::fileName((DeepTiledInputFile *)0x1c6a3a);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\" to image file \"");
    pcVar4 = fileName((DeepTiledOutputFile *)0x1c6a8e);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\" failed.  The files have different channel lists.");
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar5,local_7e8);
    __cxa_throw(pAVar5,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  bVar2 = TileOffsets::isEmpty(in_stack_fffffffffffff328);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_970);
    poVar3 = std::operator<<(local_960,"Quick pixel copy from image file \"");
    pcVar4 = DeepTiledInputFile::fileName((DeepTiledInputFile *)0x1c6bbc);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\" to image file \"");
    pcVar4 = OStream::fileName((OStream *)0x1c6c1f);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\" failed. \"");
    pcVar4 = fileName((DeepTiledOutputFile *)0x1c6c73);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\" already contains pixel data.");
    this_01 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::LogicExc::LogicExc(this_01,local_970);
    __cxa_throw(this_01,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
  }
  local_978 = DeepTiledInputFile::totalTiles(in_stack_fffffffffffff340);
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
  std::allocator<int>::allocator((allocator<int> *)0x1c6dd5);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff320,
             (size_type)in_stack_fffffffffffff318,(allocator_type *)in_stack_fffffffffffff310);
  std::allocator<int>::~allocator((allocator<int> *)0x1c6e01);
  std::allocator<int>::allocator((allocator<int> *)0x1c6e5c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff320,
             (size_type)in_stack_fffffffffffff318,(allocator_type *)in_stack_fffffffffffff310);
  std::allocator<int>::~allocator((allocator<int> *)0x1c6e88);
  std::allocator<int>::allocator((allocator<int> *)0x1c6ee3);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff320,
             (size_type)in_stack_fffffffffffff318,(allocator_type *)in_stack_fffffffffffff310);
  std::allocator<int>::~allocator((allocator<int> *)0x1c6f0f);
  std::allocator<int>::allocator((allocator<int> *)0x1c6f6a);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff320,
             (size_type)in_stack_fffffffffffff318,(allocator_type *)in_stack_fffffffffffff310);
  std::allocator<int>::~allocator((allocator<int> *)0x1c6f96);
  if (*(int *)(*(long *)(in_RDI + 8) + 0xc0) == 2) {
    std::vector<int,_std::allocator<int>_>::operator[](&local_998,0);
    std::vector<int,_std::allocator<int>_>::operator[](&local_9b8,0);
    std::vector<int,_std::allocator<int>_>::operator[](&local_9d8,0);
    std::vector<int,_std::allocator<int>_>::operator[](&local_9f8,0);
    DeepTiledInputFile::getTileOrder
              (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0,
               in_stack_fffffffffffff4c8,(int *)in_stack_fffffffffffff4c0);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_998,0);
    *(value_type *)(*(long *)(in_RDI + 8) + 0x188) = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_9b8,0);
    *(value_type *)(*(long *)(in_RDI + 8) + 0x18c) = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_9d8,0);
    *(value_type *)(*(long *)(in_RDI + 8) + 400) = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_9f8,0);
    *(value_type *)(*(long *)(in_RDI + 8) + 0x194) = *pvVar8;
  }
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318,
             (allocator_type *)in_stack_fffffffffffff310);
  std::allocator<char>::~allocator(&local_a19);
  TVar11._8_8_ = in_stack_fffffffffffff320;
  TVar11._0_8_ = in_stack_fffffffffffff328;
  for (local_a28 = 0; local_a28 < local_978; local_a28 = local_a28 + 1) {
    this_02 = &local_a18;
    unpackedDataSize = std::vector<char,_std::allocator<char>_>::size(this_02);
    sampleCountTableSize_00 = local_20;
    std::vector<char,_std::allocator<char>_>::operator[](this_02,0);
    DeepTiledInputFile::rawTileData
              (in_stack_fffffffffffff700,(int *)in_stack_fffffffffffff6f8,
               (int *)in_stack_fffffffffffff6f0,(int *)in_stack_fffffffffffff6e8,
               in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
               (uint64_t *)in_stack_fffffffffffff710);
    sVar9 = std::vector<char,_std::allocator<char>_>::size(&local_a18);
    if (sVar9 < unpackedDataSize) {
      std::vector<char,_std::allocator<char>_>::resize
                (TVar11._8_8_,(size_type)in_stack_fffffffffffff318);
      in_stack_fffffffffffff340 = local_20;
      std::vector<char,_std::allocator<char>_>::operator[](&local_a18,0);
      DeepTiledInputFile::rawTileData
                (in_stack_fffffffffffff700,(int *)in_stack_fffffffffffff6f8,
                 (int *)in_stack_fffffffffffff6f0,(int *)in_stack_fffffffffffff6e8,
                 in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,
                 (uint64_t *)in_stack_fffffffffffff710);
    }
    ofd = (Data *)&local_a18;
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)ofd,0);
    in_stack_fffffffffffff310 = *(Box<Imath_3_2::Vec2<int>_> **)(pvVar10 + 0x10);
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)ofd,0);
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)ofd,0);
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)ofd,0);
    anon_unknown_7::writeTileData
              (ofd,TVar11.dy,TVar11.dx,TVar11.ly,TVar11.lx,in_stack_fffffffffffff318,
               (uint64_t)in_stack_fffffffffffff340,unpackedDataSize,(char *)this_02,
               (uint64_t)sampleCountTableSize_00);
    if (*(int *)(*(long *)(in_RDI + 8) + 0xc0) == 2) {
      if (local_a28 < local_978 - 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_998,local_a28 + 1);
        *(value_type *)(*(long *)(in_RDI + 8) + 0x188) = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_9b8,local_a28 + 1);
        *(value_type *)(*(long *)(in_RDI + 8) + 0x18c) = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_9d8,local_a28 + 1);
        *(value_type *)(*(long *)(in_RDI + 8) + 400) = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_9f8,local_a28 + 1);
        *(value_type *)(*(long *)(in_RDI + 8) + 0x194) = *pvVar8;
      }
    }
    else {
      TVar11 = Data::nextTileCoord(in_stack_fffffffffffff4c0,
                                   (TileCoord *)CONCAT44(CVar12,in_stack_fffffffffffff4b8));
      *(TileCoord *)(*(long *)(in_RDI + 8) + 0x188) = TVar11;
    }
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff310);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff310);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff310);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff310);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff310);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1c766c);
  return;
}

Assistant:

void
DeepTiledOutputFile::copyPixels (DeepTiledInputFile& in)
{

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!(hdr.tileDescription () == inHdr.tileDescription ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different tile descriptions.");

    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". The "
                   "files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" "
                   "failed.  The files have different channel "
                   "lists.");

    // Verify that no pixel data have been written to this file yet.
    //

    if (!_data->tileOffsets.isEmpty ())
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << _data->_streamData->os->fileName ()
                << "\" "
                   "failed. \""
                << fileName ()
                << "\" "
                   "already contains pixel data.");

    size_t numAllTiles = in.totalTiles ();

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // special handling for random tiles
    //

    vector<int> dx_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> dy_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> lx_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> ly_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);

    if (_data->lineOrder == RANDOM_Y)
    {
        in.getTileOrder (&dx_list[0], &dy_list[0], &lx_list[0], &ly_list[0]);
        _data->nextTileToWrite.dx = dx_list[0];
        _data->nextTileToWrite.dy = dy_list[0];
        _data->nextTileToWrite.lx = lx_list[0];
        _data->nextTileToWrite.ly = ly_list[0];
    }

    vector<char> data (4096);
    for (size_t i = 0; i < numAllTiles; ++i)
    {

        int dx = _data->nextTileToWrite.dx;
        int dy = _data->nextTileToWrite.dy;
        int lx = _data->nextTileToWrite.lx;
        int ly = _data->nextTileToWrite.ly;

        uint64_t dataSize = data.size ();

        in.rawTileData (dx, dy, lx, ly, &data[0], dataSize);
        if (dataSize > data.size ())
        {
            data.resize (dataSize);
            in.rawTileData (dx, dy, lx, ly, &data[0], dataSize);
        }
        uint64_t sampleCountTableSize  = *(uint64_t*) (&data[0] + 16);
        uint64_t pixelDataSize         = *(uint64_t*) (&data[0] + 24);
        uint64_t unpackedPixelDataSize = *(uint64_t*) (&data[0] + 32);
        char*    sampleCountTable      = &data[0] + 40;
        char*    pixelData = sampleCountTable + sampleCountTableSize;

        writeTileData (
            _data,
            dx,
            dy,
            lx,
            ly,
            pixelData,
            pixelDataSize,
            unpackedPixelDataSize,
            sampleCountTable,
            sampleCountTableSize);

        if (_data->lineOrder == RANDOM_Y)
        {
            if (i < numAllTiles - 1)
            {
                _data->nextTileToWrite.dx = dx_list[i + 1];
                _data->nextTileToWrite.dy = dy_list[i + 1];
                _data->nextTileToWrite.lx = lx_list[i + 1];
                _data->nextTileToWrite.ly = ly_list[i + 1];
            }
        }
        else
        {
            _data->nextTileToWrite =
                _data->nextTileCoord (_data->nextTileToWrite);
        }
    }
}